

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::access_chain_needs_stage_io_builtin_translation
          (CompilerMSL *this,uint32_t base)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  bool local_39;
  bool redirect_builtin;
  SPIRVariable *var;
  uint32_t base_local;
  CompilerMSL *this_local;
  
  pSVar2 = Compiler::maybe_get_backing_variable((Compiler *)this,base);
  if ((pSVar2 != (SPIRVariable *)0x0) &&
     (bVar1 = Compiler::is_tessellation_shader((Compiler *)this), bVar1)) {
    bVar1 = is_tese_shader(this);
    if (bVar1) {
      local_39 = pSVar2->storage == StorageClassOutput;
    }
    else {
      local_39 = false;
    }
    return local_39;
  }
  return true;
}

Assistant:

bool CompilerMSL::access_chain_needs_stage_io_builtin_translation(uint32_t base)
{
	auto *var = maybe_get_backing_variable(base);
	if (!var || !is_tessellation_shader())
		return true;

	// We only need to rewrite builtin access chains when accessing flattened builtins like gl_ClipDistance_N.
	// Avoid overriding it back to just gl_ClipDistance.
	// This can only happen in scenarios where we cannot flatten/unflatten access chains, so, the only case
	// where this triggers is evaluation shader inputs.
	bool redirect_builtin = is_tese_shader() ? var->storage == StorageClassOutput : false;
	return redirect_builtin;
}